

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluation.c
# Opt level: O0

Expr gensym(pExecutor exec,pContext_conflict defContext,pContext_conflict callContext,Expr *args,
           int argc)

{
  _Bool _Var1;
  int iVar2;
  size_t sVar3;
  anon_union_8_8_707b72ea_for_Expr_1 key;
  Expr EVar4;
  Expr EVar5;
  Expr expr;
  Expr expr_00;
  Expr num;
  Expr value_00;
  undefined4 uStack_94;
  size_t found;
  long lStack_78;
  char name [7];
  long n;
  undefined1 local_60 [8];
  Expr value;
  Expr counter;
  int argc_local;
  Expr *args_local;
  pContext_conflict callContext_local;
  pContext_conflict defContext_local;
  pExecutor exec_local;
  Expr res;
  
  if (argc != 0) {
    printf("gensym: too many arguments\n");
    exit(1);
  }
  EVar4 = make_atom(exec,"*gensym-counter*");
  key = EVar4.field_1;
  value.field_1.val_atom._0_4_ = EVar4.type;
  EVar4._4_4_ = 0;
  EVar4.type = value.field_1.val_atom._0_4_;
  EVar4.field_1.val_atom = key.val_atom;
  _Var1 = is_none(EVar4);
  if (_Var1) {
    printf("gensym: make_atom failed\n");
    exit(1);
  }
  iVar2 = context_get(defContext,key.val_atom,(Expr *)local_60);
  if ((iVar2 == -1) ||
     (expr._0_8_ = (ulong)local_60 & 0xffffffff,
     expr.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)value._0_8_, _Var1 = is_int(expr), !_Var1))
  {
    EVar4 = make_int_one(exec);
    value._0_8_ = EVar4.field_1;
    local_60 = (undefined1  [8])CONCAT44(n._4_4_,EVar4.type);
    expr_00._4_4_ = 0;
    expr_00.type = EVar4.type;
    expr_00.field_1.val_atom = value._0_8_;
    _Var1 = is_none(expr_00);
    if (_Var1) {
      printf("gensym: exec_int_one failed\n");
      exit(1);
    }
  }
  num._0_8_ = (ulong)local_60 & 0xffffffff;
  num.field_1 = (anon_union_8_8_707b72ea_for_Expr_1)value._0_8_;
  lStack_78 = exec_int_to_long(exec,num);
  while( true ) {
    sprintf((char *)((long)&found + 1),"#:%ld",lStack_78);
    sVar3 = find_atom(exec,(char *)((long)&found + 1));
    if (sVar3 == 0x7fffffff) {
      printf("gensym: find_atom failed\n");
      exit(1);
    }
    if (sVar3 == 0x7ffffffe) break;
    lStack_78 = lStack_78 + 1;
  }
  EVar4 = make_atom(exec,(char *)((long)&found + 1));
  EVar5.field_1 = EVar4.field_1;
  EVar5.type = EVar4.type;
  if (EVar5.type != VT_NONE) {
    EVar4 = make_int_from_long(exec,lStack_78);
    value._0_8_ = EVar4.field_1;
    local_60._4_4_ = uStack_94;
    local_60._0_4_ = EVar4.type;
    value_00._4_4_ = 0;
    value_00.type = EVar4.type;
    value_00.field_1.val_atom = value._0_8_;
    iVar2 = context_set(defContext,key.val_atom,value_00);
    if (iVar2 != -1) {
      EVar5._4_4_ = 0;
      return EVar5;
    }
    printf("gensym: context_bind failed\n");
    exit(1);
  }
  printf("gensym: make_atom failed\n");
  exit(1);
}

Assistant:

BUILTIN_FUNC(gensym)
{
    if (argc != 0)
    {
        log("gensym: too many arguments");
        exit(1);
    }
    Expr counter = make_atom(exec, "*gensym-counter*");
    if (is_none(counter))
    {
        log("gensym: make_atom failed");
        exit(1);
    }
    Expr value;
    if (context_get(defContext, counter.val_atom, &value) == MAP_FAILED || !is_int(value))
    {
        value = make_int_one(exec);
        if (is_none(value))
        {
            log("gensym: exec_int_one failed");
            exit(1);
        }
    }
    long n = exec_int_to_long(exec, value);
    for (;; n++)
    {
        char name[7];
        sprintf(name, "#:%ld", n);
        size_t found = find_atom(exec, name);
        if (found == EXPR_ERROR)
        {
            log("gensym: find_atom failed");
            exit(1);
        }
        if (found == EXPR_NOT_FOUND)
        {
            Expr res = make_atom(exec, name);
            if (res.type == VT_NONE)
            {
                log("gensym: make_atom failed");
                exit(1);
            }
            value = make_int_from_long(exec, n);
            if (context_set(defContext, counter.val_atom, value) == MAP_FAILED)
            {
                log("gensym: context_bind failed");
                exit(1);
            }
            return res;
        }
    }
}